

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMeshDecimator.cpp
# Opt level: O2

bool __thiscall
HACD::MeshDecimator::Decimate
          (MeshDecimator *this,size_t targetNVertices,size_t targetNTriangles,double targetError)

{
  CallBackFunction p_Var1;
  ulong uVar2;
  undefined1 *puVar3;
  bool bVar4;
  ostream *poVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 in_XMM4 [16];
  double qem;
  ostringstream msg_1;
  char msg [1024];
  double local_5f8;
  double local_5f0;
  undefined1 *local_5e8;
  double local_5e0;
  double local_5d8;
  char *local_5d0 [4];
  ostringstream local_5b0 [376];
  char local_438 [1032];
  
  local_5f8 = 0.0;
  local_5f0 = targetError;
  if (this->m_callBack != (CallBackFunction)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_5b0);
    poVar5 = std::operator<<((ostream *)local_5b0,"+ Mesh");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"\t # vertices                     \t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"\t # triangles                    \t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"+ Parameters");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"\t target # of vertices           \t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"\t target # of triangles          \t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)local_5b0,"\t QEM\t\t\t                  \t");
    poVar5 = std::ostream::_M_insert<double>(local_5f0);
    std::endl<char,std::char_traits<char>>(poVar5);
    p_Var1 = this->m_callBack;
    std::__cxx11::stringbuf::str();
    (*p_Var1)(local_5d0[0],0.0,0.0,this->m_nPoints);
    std::__cxx11::string::~string((string *)local_5d0);
    std::__cxx11::ostringstream::~ostringstream(local_5b0);
    if (this->m_callBack != (CallBackFunction)0x0) {
      (*this->m_callBack)("+ Initialize QEM \n",0.0,0.0,this->m_nPoints);
    }
  }
  InitializeQEM(this);
  if (this->m_callBack != (CallBackFunction)0x0) {
    (*this->m_callBack)("+ Initialize priority queue \n",0.0,0.0,this->m_nPoints);
  }
  InitializePriorityQueue(this);
  if (this->m_callBack != (CallBackFunction)0x0) {
    (*this->m_callBack)("+ Simplification \n",0.0,0.0,this->m_nPoints);
  }
  local_5d8 = 1.0 / (this->m_diagBB * this->m_diagBB);
  local_5e8 = &DAT_bff0000000000000;
  auVar9 = ZEXT864(0) << 0x40;
  while (((((this->m_pqueue).c.
            super__Vector_base<HACD::MDEdgePriorityQueue,_std::allocator<HACD::MDEdgePriorityQueue>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->m_pqueue).c.
            super__Vector_base<HACD::MDEdgePriorityQueue,_std::allocator<HACD::MDEdgePriorityQueue>_>
            ._M_impl.super__Vector_impl_data._M_start && (this->m_nEdges != 0)) &&
          (uVar2 = this->m_nVertices, targetNVertices < uVar2)) &&
         ((targetNTriangles < this->m_nTriangles && (dVar7 = auVar9._0_8_, dVar7 < local_5f0))))) {
    auVar6 = vcvtusi2sd_avx512f(in_XMM4,uVar2);
    auVar8 = vcvtusi2sd_avx512f(in_XMM4,this->m_nPoints);
    puVar3 = (undefined1 *)(100.0 - (auVar6._0_8_ * 100.0) / auVar8._0_8_);
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (double)puVar3 - (double)local_5e8;
    auVar6 = vandpd_avx512vl(auVar8,auVar6);
    if ((1.0 < auVar6._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
      local_5e0 = dVar7;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        auVar6 = vsqrtsd_avx(auVar9._0_16_,auVar9._0_16_);
        dVar7 = auVar6._0_8_;
      }
      sprintf(local_438,"%3.2f %% V = %lu \t QEM = %f \t \t \r",puVar3,dVar7,uVar2);
      (*this->m_callBack)(local_438,(double)puVar3,local_5e0,this->m_nVertices);
      local_5e8 = puVar3;
    }
    bVar4 = EdgeCollapse(this,&local_5f8);
    if (!bVar4) break;
    local_5f8 = local_5d8 * local_5f8;
    auVar9 = ZEXT864((ulong)local_5f8);
  }
  if (this->m_callBack != (CallBackFunction)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_5b0);
    poVar5 = std::operator<<((ostream *)local_5b0,"+ Simplification output");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"\t # vertices                     \t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)local_5b0,"\t # triangles                    \t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)local_5b0,"\t QEM\t\t\t\t\t          \t");
    dVar7 = local_5f8;
    poVar5 = std::ostream::_M_insert<double>(local_5f8);
    std::endl<char,std::char_traits<char>>(poVar5);
    p_Var1 = this->m_callBack;
    std::__cxx11::stringbuf::str();
    (*p_Var1)(local_5d0[0],100.0,dVar7,this->m_nVertices);
    std::__cxx11::string::~string((string *)local_5d0);
    std::__cxx11::ostringstream::~ostringstream(local_5b0);
  }
  return true;
}

Assistant:

bool MeshDecimator::Decimate(size_t targetNVertices, size_t targetNTriangles, double targetError)
	{
		double qem = 0.0;
		double progressOld = -1.0;
		double progress = 0.0;    
		char msg[1024];
		double ptgStep = 1.0;

		if (m_callBack)
		{
			std::ostringstream msg;
			msg << "+ Mesh" << std::endl;
			msg << "\t # vertices                     \t" << m_nPoints << std::endl;
			msg << "\t # triangles                    \t" << m_nTriangles << std::endl;
			msg << "+ Parameters" << std::endl;
			msg << "\t target # of vertices           \t" << targetNVertices << std::endl;
			msg << "\t target # of triangles          \t" << targetNTriangles << std::endl;
			msg << "\t QEM			                  \t" << targetError << std::endl;
			(*m_callBack)(msg.str().c_str(), 0.0, 0.0, m_nPoints);
		}
		
		if (m_callBack) (*m_callBack)("+ Initialize QEM \n", 0.0, 0.0, m_nPoints);
		InitializeQEM();
		if (m_callBack) (*m_callBack)("+ Initialize priority queue \n", 0.0, 0.0, m_nPoints);
		InitializePriorityQueue();
		if (m_callBack) (*m_callBack)("+ Simplification \n", 0.0, 0.0, m_nPoints);
		double invDiag2 = 1.0 / (m_diagBB * m_diagBB);
		while((m_pqueue.size() > 0) && 
			  (m_nEdges > 0) && 
			  (m_nVertices > targetNVertices) &&
			  (m_nTriangles > targetNTriangles) &&
			  (qem < targetError))
		{
			progress = 100.0 - m_nVertices * 100.0 / m_nPoints;
			if (fabs(progress-progressOld) > ptgStep && m_callBack)
			{
				sprintf(msg, "%3.2f %% V = %lu \t QEM = %f \t \t \r", progress, static_cast<unsigned long>(m_nVertices), sqrt(qem));
				(*m_callBack)(msg, progress, qem, m_nVertices);
				progressOld = progress;
			}
			if (!EdgeCollapse(qem)) break;
			qem *= invDiag2;
		}
		if (m_callBack)
		{
			std::ostringstream msg;
			msg << "+ Simplification output" << std::endl;
			msg << "\t # vertices                     \t" << m_nVertices << std::endl;
			msg << "\t # triangles                    \t" << m_nTriangles << std::endl;
			msg << "\t QEM					          \t" << qem << std::endl;
			(*m_callBack)(msg.str().c_str(), 100.0, qem, m_nVertices);
		}
		return true;
	}